

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O1

void __thiscall ncnn::Mat::~Mat(Mat *this)

{
  int *piVar1;
  
  piVar1 = this->refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (this->data != (void *)0x0)) {
      free(*(void **)((long)this->data + -8));
    }
  }
  this->h = 0;
  this->c = 0;
  this->cstep = 0;
  this->elemsize = 0;
  this->dims = 0;
  this->w = 0;
  this->data = (void *)0x0;
  this->refcount = (int *)0x0;
  return;
}

Assistant:

inline Mat::~Mat()
{
    release();
}